

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

bool __thiscall HighsDomain::ObjectivePropagation::shouldBePropagated(ObjectivePropagation *this)

{
  double dVar1;
  
  if ((((this->isPropagated == false) && (this->numInfObjLower < 2)) &&
      (this->domain->infeasible_ == false)) &&
     (dVar1 = ((this->domain->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit,
     dVar1 < INFINITY)) {
    dVar1 = dVar1 - ((this->objectiveLower).hi + (this->objectiveLower).lo);
    return dVar1 < this->capacityThreshold || dVar1 == this->capacityThreshold;
  }
  return false;
}

Assistant:

bool HighsDomain::ObjectivePropagation::shouldBePropagated() const {
  if (isPropagated) return false;
  if (numInfObjLower > 1) return false;
  if (domain->infeasible_) return false;
  double upperLimit = domain->mipsolver->mipdata_->upper_limit;
  if (upperLimit == kHighsInf) return false;
  if (upperLimit - double(objectiveLower) > capacityThreshold) return false;

  return true;
}